

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitLocalSet(OptimizeInstructions *this,LocalSet *curr)

{
  RefAs *this_00;
  PassRunner *pPVar1;
  bool bVar2;
  Type TVar3;
  
  this_00 = (RefAs *)curr->value;
  if (((this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id == RefAsId
      ) && (this_00->op == RefAsNonNull)) {
    TVar3 = Function::getLocalType
                      ((this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currFunction,curr->index);
    if (((uint)TVar3.id & 3) == 2 && 6 < TVar3.id) {
      bVar2 = LocalSet::isTee(curr);
      if (bVar2) {
        curr->value = this_00->value;
        LocalSet::finalize(curr);
        this_00->value = (Expression *)curr;
        RefAs::finalize(this_00);
        replaceCurrent(this,(Expression *)this_00);
        return;
      }
      pPVar1 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner;
      if (((pPVar1->options).ignoreImplicitTraps != false) ||
         ((pPVar1->options).trapsNeverHappen == true)) {
        curr->value = this_00->value;
      }
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // Interactions between local.set/tee and ref.as_non_null can be optimized
    // in some cases, by removing or moving the ref.as_non_null operation.
    if (auto* as = curr->value->dynCast<RefAs>()) {
      if (as->op == RefAsNonNull &&
          getFunction()->getLocalType(curr->index).isNullable()) {
        //   (local.tee (ref.as_non_null ..))
        // =>
        //   (ref.as_non_null (local.tee ..))
        //
        // The reordering allows the ref.as to be potentially optimized further
        // based on where the value flows to.
        if (curr->isTee()) {
          curr->value = as->value;
          curr->finalize();
          as->value = curr;
          as->finalize();
          replaceCurrent(as);
          return;
        }

        // Otherwise, if this is not a tee, then no value falls through. The
        // ref.as_non_null acts as a null check here, basically. If we are
        // ignoring such traps, we can remove it.
        auto& passOptions = getPassOptions();
        if (passOptions.ignoreImplicitTraps || passOptions.trapsNeverHappen) {
          curr->value = as->value;
        }
      }
    }
  }